

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r20_conv.cpp
# Opt level: O2

precise_unit units::r20_unit(string *r20_string)

{
  char *__s2;
  int iVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  qword qVar4;
  undefined1 *puVar5;
  double dVar6;
  precise_unit pVar7;
  
  __s2 = (r20_string->_M_dataplus)._M_p;
  puVar5 = precise::r20_units;
  uVar2 = 0x828;
  while (uVar3 = uVar2, 0 < (long)uVar3) {
    uVar2 = uVar3 >> 1;
    iVar1 = strcmp((char *)((Elf64_Dyn *)((long)puVar5 + (uVar2 * 2 + 1) * 0x10))->d_val,__s2);
    if (iVar1 < 0) {
      puVar5 = (undefined1 *)((long)puVar5 + (uVar2 * 2 + 2) * 0x10);
      uVar2 = ~uVar2 + uVar3;
    }
  }
  qVar4 = 0xfa94a488;
  dVar6 = NAN;
  if ((Elf64_Dyn *)puVar5 != _DYNAMIC) {
    iVar1 = strcmp((char *)((Elf64_Dyn *)((long)puVar5 + 0x10))->d_val,__s2);
    dVar6 = NAN;
    if (iVar1 == 0) {
      dVar6 = (double)((Elf64_Dyn *)puVar5)->d_tag;
      qVar4 = ((Elf64_Dyn *)puVar5)->d_val;
    }
  }
  pVar7.base_units_ = (unit_data)(int)qVar4;
  pVar7.commodity_ = (int)(qVar4 >> 0x20);
  pVar7.multiplier_ = dVar6;
  return pVar7;
}

Assistant:

precise_unit r20_unit(const std::string& r20_string)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto ind = std::lower_bound(
        precise::r20_units.begin(),
        precise::r20_units.end(),
        r20_string,
        [](const precise::unitD& u_set, const std::string& val) {
            return (strcmp(std::get<0>(u_set), val.c_str()) < 0);
        });
    if (ind == precise::r20_units.end()) {
        return precise::invalid;
    }
    if (strcmp(std::get<0>(*ind), r20_string.c_str()) == 0) {
        return std::get<2>(*ind);
    }
    return precise::invalid;
}